

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
          (Fault *this,char *file,int line,int code,char *condition,char *macroArgs,PathPtr *params)

{
  char *pcVar1;
  size_t sVar2;
  String argValues [1];
  char **ppcVar3;
  undefined8 uVar4;
  char *local_78;
  size_t sStack_70;
  ArrayDisposer *pAStack_68;
  char *local_60;
  char **local_58;
  undefined8 uStack_50;
  String local_48;
  
  this->exception = (Exception *)0x0;
  local_60 = macroArgs;
  PathPtr::toString(&local_48,params,false);
  ppcVar3 = &local_78;
  local_78 = local_48.content.ptr;
  sStack_70 = local_48.content.size_;
  pAStack_68 = local_48.content.disposer;
  uStack_50 = 1;
  uVar4 = 1;
  local_58 = ppcVar3;
  init(this,(EVP_PKEY_CTX *)file);
  sVar2 = sStack_70;
  pcVar1 = local_78;
  if (local_78 != (char *)0x0) {
    local_78 = (char *)0x0;
    sStack_70 = 0;
    (**pAStack_68->_vptr_ArrayDisposer)(pAStack_68,pcVar1,1,sVar2,sVar2,0,ppcVar3,uVar4);
  }
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}